

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_compare.cpp
# Opt level: O0

int __thiscall
ON_String::Compare(ON_String *this,char *other_string,ON_Locale *locale,bool bIgnoreCase)

{
  int iVar1;
  char *string1;
  bool bIgnoreCase_local;
  ON_Locale *locale_local;
  char *other_string_local;
  ON_String *this_local;
  
  string1 = operator_cast_to_char_(this);
  iVar1 = Length(this);
  iVar1 = Compare(string1,iVar1,other_string,-1,locale,bIgnoreCase);
  return iVar1;
}

Assistant:

int ON_String::Compare(
  const char* other_string,
  const class ON_Locale& locale,
  bool bIgnoreCase
  ) const
{
  return ON_String::Compare(
    static_cast< const char* >(*this),
    this->Length(),
    other_string,
    -1,
    locale,
    bIgnoreCase
    );
}